

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_bn_sx_sy_w8n_sse4_1
               (uint16_t *dst,uint32_t dst_stride,uint16_t *src0,uint32_t src0_stride,uint16_t *src1
               ,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h,
               blend_unit_fn blend)

{
  uint in_ECX;
  long in_RDX;
  longlong extraout_RDX;
  ulong in_RSI;
  ulong uVar1;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  undefined8 extraout_XMM0_Qa;
  __m128i alVar2;
  __m128i v_val_w;
  long in_stack_00000008;
  __m128i v_res_w;
  __m128i v_m1_w;
  __m128i v_m0_w;
  __m128i v_rs_w;
  __m128i v_rvsb_w;
  __m128i v_rvsa_w;
  __m128i v_rvs_b;
  __m128i v_rb_b;
  __m128i v_ra_b;
  int c;
  __m128i v_maxval_w;
  __m128i v_zmask_b;
  undefined4 local_14c;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  
  uVar1 = in_RSI;
  local_118 = in_R8;
  local_108 = in_RDX;
  local_f8 = in_RDI;
  do {
    for (local_14c = 0; local_14c < (int)v_res_w[1]; local_14c = local_14c + 8) {
      xx_loadu_128((void *)(in_stack_00000008 + local_14c * 2));
      alVar2 = xx_loadu_128((void *)(in_stack_00000008 + local_14c * 2 + (ulong)(uint)v_res_w[0]));
      v_val_w[1] = uVar1;
      v_val_w[0] = 2;
      alVar2 = xx_roundn_epu16(v_val_w,(int)alVar2[1]);
      local_48 = (short)extraout_XMM0_Qa;
      uStack_46 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
      uStack_44 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
      uStack_42 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
      uVar1 = local_118 + (long)local_14c * 2;
      (*(code *)v_m1_w[1])
                (extraout_XMM0_Qa,
                 CONCAT26(0x40 - uStack_42,
                          CONCAT24(0x40 - uStack_44,CONCAT22(0x40 - uStack_46,0x40 - local_48))),
                 local_108 + (long)local_14c * 2,uVar1,alVar2[1]);
      alVar2[1] = extraout_RDX;
      alVar2[0] = uVar1;
      xx_storeu_128((void *)(local_f8 + (long)local_14c * 2),alVar2);
    }
    local_f8 = local_f8 + (in_RSI & 0xffffffff) * 2;
    local_108 = local_108 + (ulong)in_ECX * 2;
    local_118 = local_118 + (ulong)in_R9D * 2;
    in_stack_00000008 = in_stack_00000008 + (ulong)((uint)v_res_w[0] << 1);
    v_m1_w[0]._0_4_ = (int)v_m1_w[0] + -1;
  } while ((int)v_m1_w[0] != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_bn_sx_sy_w8n_sse4_1(
    uint16_t *dst, uint32_t dst_stride, const uint16_t *src0,
    uint32_t src0_stride, const uint16_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h,
    blend_unit_fn blend) {
  const __m128i v_zmask_b =
      _mm_set_epi8(0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1, 0, -1);
  const __m128i v_maxval_w = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);

  do {
    int c;
    for (c = 0; c < w; c += 8) {
      const __m128i v_ra_b = xx_loadu_128(mask + 2 * c);
      const __m128i v_rb_b = xx_loadu_128(mask + 2 * c + mask_stride);
      const __m128i v_rvs_b = _mm_add_epi8(v_ra_b, v_rb_b);
      const __m128i v_rvsa_w = _mm_and_si128(v_rvs_b, v_zmask_b);
      const __m128i v_rvsb_w =
          _mm_and_si128(_mm_srli_si128(v_rvs_b, 1), v_zmask_b);
      const __m128i v_rs_w = _mm_add_epi16(v_rvsa_w, v_rvsb_w);

      const __m128i v_m0_w = xx_roundn_epu16(v_rs_w, 2);
      const __m128i v_m1_w = _mm_sub_epi16(v_maxval_w, v_m0_w);

      const __m128i v_res_w = blend(src0 + c, src1 + c, v_m0_w, v_m1_w);

      xx_storeu_128(dst + c, v_res_w);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += 2 * mask_stride;
  } while (--h);
}